

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O0

bool __thiscall
ASecActHitFakeFloor::DoTriggerAction(ASecActHitFakeFloor *this,AActor *triggerer,int activationType)

{
  bool bVar1;
  undefined1 local_29;
  bool didit;
  int activationType_local;
  AActor *triggerer_local;
  ASecActHitFakeFloor *this_local;
  
  if ((activationType & 0x400U) == 0) {
    local_29 = false;
  }
  else {
    local_29 = ASectorAction::CheckTrigger(&this->super_ASectorAction,triggerer);
  }
  bVar1 = ASectorAction::DoTriggerAction(&this->super_ASectorAction,triggerer,activationType);
  return local_29 != false || bVar1;
}

Assistant:

bool ASecActHitFakeFloor::DoTriggerAction (AActor *triggerer, int activationType)
{
	bool didit = (activationType & SECSPAC_HitFakeFloor) ? CheckTrigger (triggerer) : false;
	return didit | Super::DoTriggerAction (triggerer, activationType);
}